

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

void __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
DoCopyMembers<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *rhs,CrtAllocator *allocator,bool copyConstStrings)

{
  uint uVar1;
  GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *rhs_00;
  ulong uVar2;
  GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *local_40;
  
  if (((rhs->data_).f.flags & 7) == 3) {
    *(undefined2 *)(this + 0xe) = 3;
    uVar1 = (rhs->data_).s.length;
    uVar2 = (ulong)uVar1;
    if (uVar2 == 0) {
      local_40 = (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)0x0;
    }
    else {
      local_40 = (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)malloc(uVar2 << 5);
    }
    if (uVar1 != 0) {
      rhs_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)((ulong)(rhs->data_).s.str & 0xffffffffffff);
      this_00 = local_40;
      do {
        GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  (this_00,rhs_00,allocator,copyConstStrings);
        GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  (this_00 + 0x10,rhs_00 + 1,allocator,copyConstStrings);
        this_00 = this_00 + 0x20;
        rhs_00 = rhs_00 + 2;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    *(uint *)(this + 4) = uVar1;
    *(uint *)this = uVar1;
    *(ulong *)(this + 8) = (ulong)*(ushort *)(this + 0xe) << 0x30 | (ulong)local_40;
    return;
  }
  __assert_fail("rhs.GetType() == kObjectType",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                ,0x94c,
                "void rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::DoCopyMembers(const GenericValue<Encoding, SourceAllocator> &, Allocator &, bool) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator, SourceAllocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

Type GetType()  const { return static_cast<Type>(data_.f.flags & kTypeMask); }